

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> *
eglu::getConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                EGLDisplay display)

{
  EGLDisplay pvVar1;
  EGLDisplay pvVar2;
  deUint32 dVar3;
  deBool dVar4;
  reference ppvVar5;
  size_type sVar6;
  int local_28;
  undefined1 local_21;
  EGLint configCount;
  EGLDisplay display_local;
  Library *egl_local;
  vector<void_*,_std::allocator<void_*>_> *configs;
  
  local_21 = 0;
  _configCount = display;
  display_local = egl;
  egl_local = (Library *)__return_storage_ptr__;
  std::vector<void_*,_std::allocator<void_*>_>::vector(__return_storage_ptr__);
  local_28 = 0;
  do {
    (**(code **)(*display_local + 0xd0))(display_local,_configCount,0,0,&local_28);
    dVar3 = (**(code **)(*display_local + 0xf8))();
    checkError(dVar3,"getConfigs(display, DE_NULL, 0, &configCount)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x66);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  if (0 < local_28) {
    std::vector<void_*,_std::allocator<void_*>_>::resize(__return_storage_ptr__,(long)local_28);
    do {
      pvVar2 = display_local;
      pvVar1 = _configCount;
      ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[](__return_storage_ptr__,0);
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size(__return_storage_ptr__);
      (**(code **)(*pvVar2 + 0xd0))(pvVar2,pvVar1,ppvVar5,sVar6 & 0xffffffff,&local_28);
      dVar3 = (**(code **)(*display_local + 0xf8))();
      checkError(dVar3,"getConfigs(display, &(configs[0]), (EGLint)configs.size(), &configCount)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x6b);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> getConfigs (const Library& egl, EGLDisplay display)
{
	vector<EGLConfig>	configs;
	EGLint				configCount	= 0;
	EGLU_CHECK_CALL(egl, getConfigs(display, DE_NULL, 0, &configCount));

	if (configCount > 0)
	{
		configs.resize(configCount);
		EGLU_CHECK_CALL(egl, getConfigs(display, &(configs[0]), (EGLint)configs.size(), &configCount));
	}

	return configs;
}